

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledMultiArg.h
# Opt level: O0

string * __thiscall
TCLAP::
UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::shortID(string *__return_storage_ptr__,
         UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,string *val)

{
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *val_local;
  UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = val;
  val_local = (string *)this;
  this_local = (UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"<",&local_61);
  std::operator+(&local_40,&local_60,
                 &(this->
                  super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )._typeDesc);
  std::operator+(__return_storage_ptr__,&local_40,"> ...");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return __return_storage_ptr__;
}

Assistant:

std::string UnlabeledMultiArg<T>::shortID(const std::string& val) const
{
	static_cast<void>(val); // Ignore input, don't warn
	return std::string("<") + _typeDesc + "> ...";
}